

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_db_cacheflush(sqlite3 *db)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  Pager *pPager;
  Btree *pBt;
  int bSeenBusy;
  int rc;
  int i;
  int local_30;
  Pager *pPager_00;
  int local_10;
  int local_c;
  
  local_10 = 0;
  bVar2 = false;
  sqlite3_mutex_enter((sqlite3_mutex *)0x13dd07);
  sqlite3BtreeEnterAll((sqlite3 *)0x13dd11);
  local_c = 0;
  while( true ) {
    bVar1 = false;
    if (local_10 == 0) {
      bVar1 = local_c < *(int *)(in_RDI + 0x28);
    }
    if (!bVar1) break;
    pPager_00 = *(Pager **)(*(long *)(in_RDI + 0x20) + (long)local_c * 0x20 + 8);
    if ((pPager_00 != (Pager *)0x0) &&
       (iVar3 = sqlite3BtreeIsInTrans((Btree *)pPager_00), iVar3 != 0)) {
      sqlite3BtreePager((Btree *)pPager_00);
      local_10 = sqlite3PagerFlush(pPager_00);
      if (local_10 == 5) {
        bVar2 = true;
        local_10 = 0;
      }
    }
    local_c = local_c + 1;
  }
  sqlite3BtreeLeaveAll((sqlite3 *)0x13ddca);
  sqlite3_mutex_leave((sqlite3_mutex *)0x13ddd8);
  if ((local_10 == 0) && (bVar2)) {
    local_30 = 5;
  }
  else {
    local_30 = local_10;
  }
  return local_30;
}

Assistant:

SQLITE_API int sqlite3_db_cacheflush(sqlite3 *db){
  int i;
  int rc = SQLITE_OK;
  int bSeenBusy = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt && sqlite3BtreeIsInTrans(pBt) ){
      Pager *pPager = sqlite3BtreePager(pBt);
      rc = sqlite3PagerFlush(pPager);
      if( rc==SQLITE_BUSY ){
        bSeenBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return ((rc==SQLITE_OK && bSeenBusy) ? SQLITE_BUSY : rc);
}